

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context)

{
  undefined8 uVar1;
  bitmask<slang::ast::ASTFlags> addedFlags;
  SourceRange range_00;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  optional<int> value;
  SourceRange sourceRange_05;
  SourceRange assignmentRange;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  Expression *pEVar5;
  uint *puVar6;
  ExpressionSyntax *pEVar7;
  unsigned_long *puVar8;
  Type *in_RDX;
  long in_RSI;
  Compilation *in_RDI;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar9;
  optional<unsigned_long> oVar10;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  sVar11;
  optional<slang::ConstantRange> oVar12;
  Type *type;
  unsigned_long width;
  StreamingConcatenationExpression *result;
  optional<unsigned_long> rangeBits;
  uint64_t argWidth;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  members;
  UnpackedUnionType *uu;
  optional<slang::ConstantRange> range;
  EvalContext evalCtx;
  optional<unsigned_int> constantWithWidth;
  Expression *withExpr;
  Type *argType;
  Expression *arg;
  StreamExpressionSyntax *argSyntax;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *__range2;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  uint64_t bitstreamWidth;
  optional<int> count;
  Diagnostic *diag;
  Expression *sliceExpr;
  anon_class_24_3_37492b14 badResult;
  uint64_t sliceSize;
  bool isRightToLeft;
  bool isDestination;
  Compilation *in_stack_fffffffffffff678;
  EvalContext *in_stack_fffffffffffff680;
  SourceLocation in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  DiagCode in_stack_fffffffffffff694;
  SourceLocation in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  DiagCode in_stack_fffffffffffff6a4;
  undefined4 in_stack_fffffffffffff6a8;
  _Storage<int,_true> in_stack_fffffffffffff6ac;
  undefined4 in_stack_fffffffffffff6b0;
  DiagCode in_stack_fffffffffffff6b4;
  EvalContext *in_stack_fffffffffffff6b8;
  anon_class_24_3_37492b14 *in_stack_fffffffffffff6c0;
  Type *in_stack_fffffffffffff6c8;
  Diagnostic *in_stack_fffffffffffff6d0;
  Type *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e7;
  SourceLocation in_stack_fffffffffffff6e8;
  StreamingConcatenationExpression *in_stack_fffffffffffff740;
  bitwidth_t width_00;
  Compilation *in_stack_fffffffffffff748;
  undefined7 in_stack_fffffffffffff750;
  bitmask<slang::ast::IntegralFlags> in_stack_fffffffffffff757;
  Compilation *in_stack_fffffffffffff758;
  Expression *in_stack_fffffffffffff788;
  iterator in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffff79f;
  iterator in_stack_fffffffffffff7a0;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  Expression *in_stack_fffffffffffff808;
  Type *in_stack_fffffffffffff810;
  Compilation *in_stack_fffffffffffff818;
  SourceLocation in_stack_fffffffffffff820;
  SourceLocation in_stack_fffffffffffff828;
  Type *in_stack_fffffffffffff840;
  byte local_701;
  byte local_6e9;
  bitmask<slang::ast::IntegralFlags> local_6c9;
  Type *local_6c8;
  unsigned_long local_6c0;
  unsigned_long local_6b8;
  bitmask<slang::ast::ASTFlags> local_6b0;
  SourceRange local_6a8;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_698;
  StreamingConcatenationExpression *local_688;
  SourceLocation local_680;
  not_null<const_slang::ast::Expression_*> local_678;
  Expression *local_670;
  undefined8 local_668;
  SourceRange local_660;
  undefined4 local_64c;
  SourceLocation local_648;
  SourceLocation SStack_640;
  undefined4 local_638;
  __unspec local_632;
  type_conflict local_631;
  _Storage<unsigned_long,_true> local_630;
  undefined1 local_628;
  uint64_t local_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined4 local_5ec;
  Symbol *local_5e8;
  Symbol *local_5e0;
  Symbol *local_5d8;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_5d0;
  UnpackedUnionType *local_5c0;
  bitwidth_t local_5b4;
  undefined8 local_5b0;
  _Storage<slang::ConstantRange,_true> local_5a8;
  undefined4 local_5a0;
  _Storage<slang::ConstantRange,_true> local_598;
  undefined4 local_590;
  bitmask<slang::ast::EvalFlags> local_589 [849];
  bitmask<slang::ast::ASTFlags> local_238 [8];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined4 local_1e4;
  undefined8 local_1e0;
  Expression *local_1d8;
  Type *local_1d0;
  undefined4 local_1c4;
  bitmask<slang::ast::ASTFlags> local_1c0;
  SourceLocation local_1b8;
  StreamExpressionSyntax *local_1b0;
  const_iterator local_1a8;
  const_iterator local_188;
  long local_178;
  unsigned_long local_f8;
  SourceRange local_f0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 local_d0;
  _Optional_payload_base<int> local_c4;
  bitmask<slang::ast::EvalFlags> local_b9;
  _Optional_payload_base<int> local_b8;
  SourceLocation local_b0;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_8c;
  Diagnostic *local_88;
  bitmask<slang::ast::ASTFlags> local_80;
  int *local_78;
  SourceLocation local_70;
  undefined4 local_68;
  bitmask<slang::ast::CompilationFlags> local_64;
  bitmask<slang::ast::ASTFlags> local_60;
  Compilation *local_58;
  uint64_t *local_50;
  long local_48;
  uint64_t local_40;
  byte local_31;
  bitmask<slang::ast::ASTFlags> local_30;
  byte local_21;
  Type *local_20;
  long local_18;
  Compilation *local_10;
  StreamingConcatenationExpression *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,LValue);
  local_21 = bitmask<slang::ast::ASTFlags>::has
                       ((bitmask<slang::ast::ASTFlags> *)
                        CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff688);
  local_31 = *(short *)(local_18 + 0x28) == 0x45;
  local_40 = 0;
  local_58 = local_10;
  local_50 = &local_40;
  local_48 = local_18;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_60,StreamingAllowed);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff688);
  local_6e9 = 0;
  if (!bVar2) {
    local_701 = 1;
    if ((local_21 & 1) == 0) {
      bitmask<slang::ast::CompilationFlags>::bitmask(&local_64,AllowSelfDeterminedStreamConcat);
      bVar2 = Compilation::hasFlag
                        (in_stack_fffffffffffff678,
                         (bitmask<slang::ast::CompilationFlags>)
                         (underlying_type)((ulong)in_stack_fffffffffffff680 >> 0x20));
      local_701 = bVar2 ^ 0xff;
    }
    local_6e9 = local_701;
  }
  pTVar4 = local_20;
  if ((local_6e9 & 1) == 0) {
    if (*(long *)(local_18 + 0x38) == 0) {
      if ((local_31 & 1) != 0) {
        local_40 = 1;
      }
    }
    else {
      uVar1 = *(undefined8 *)(local_18 + 0x38);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_80,AllowDataType);
      iVar3 = Expression::bind((int)uVar1,(sockaddr *)pTVar4,(socklen_t)local_80.m_bits);
      local_78 = (int *)CONCAT44(extraout_var,iVar3);
      bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff680);
      if (bVar2) {
        pEVar5 = fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
        return pEVar5;
      }
      if (*local_78 == 0x17) {
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xa46be9);
        bVar2 = Type::isFixedSize(in_stack_fffffffffffff6c8);
        if (!bVar2) {
          local_8c = 0x2d0007;
          local_a0 = *(undefined8 *)(local_78 + 8);
          local_98 = *(undefined8 *)(local_78 + 10);
          sourceRange.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
          sourceRange.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
          sourceRange.startLoc._0_4_ = in_stack_fffffffffffff6a0;
          sourceRange.endLoc._0_4_ = in_stack_fffffffffffff6a8;
          sourceRange.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
          local_88 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,
                                         in_stack_fffffffffffff6b4,sourceRange);
          not_null<const_slang::ast::Type_*>::operator->
                    ((not_null<const_slang::ast::Type_*> *)0xa46c63);
          bVar2 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa46c6f);
          if (bVar2) {
            local_a4 = 0x50001;
            pTVar4 = not_null<const_slang::ast::Type_*>::operator->
                               ((not_null<const_slang::ast::Type_*> *)0xa46ca3);
            local_b0 = (pTVar4->super_Symbol).location;
            Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffff680,in_stack_fffffffffffff694,
                                in_stack_fffffffffffff688);
          }
          pEVar5 = fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
          return pEVar5;
        }
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0xa46cf6);
        local_40 = Type::getBitstreamWidth((Type *)in_stack_fffffffffffff688);
      }
      else {
        memset(&local_b9,0,1);
        bitmask<slang::ast::EvalFlags>::bitmask(&local_b9);
        local_c4 = (_Optional_payload_base<int>)
                   ASTContext::evalInteger
                             ((ASTContext *)in_stack_fffffffffffff790.current,
                              in_stack_fffffffffffff788,in_stack_fffffffffffff79f);
        local_d8 = *(undefined8 *)(local_78 + 8);
        local_d0 = *(undefined8 *)(local_78 + 10);
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _4_4_ = in_stack_fffffffffffff6b0;
        value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
        _M_payload._M_value = in_stack_fffffffffffff6ac._M_value;
        range_00.endLoc._0_4_ = in_stack_fffffffffffff6a0;
        range_00.startLoc = in_stack_fffffffffffff698;
        range_00.endLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
        range_00.endLoc._6_2_ = in_stack_fffffffffffff6a4.code;
        local_b8 = local_c4;
        bVar2 = ASTContext::requireGtZero
                          ((ASTContext *)
                           CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),value,
                           range_00);
        if (!bVar2) {
          pEVar5 = fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
          return pEVar5;
        }
        puVar6 = (uint *)std::optional<int>::operator*((optional<int> *)0xa46df1);
        local_40 = (uint64_t)*puVar6;
      }
      if ((local_31 & 1) == 0) {
        local_40 = 0;
        local_dc = 0xc20007;
        local_f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff6d0);
        sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
        sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
        sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffff6a0;
        sourceRange_00.endLoc._0_4_ = in_stack_fffffffffffff6a8;
        sourceRange_00.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                            sourceRange_00);
      }
    }
    local_f8 = 0;
    SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL>::SmallVector
              ((SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> *)
               0xa46ea6);
    local_178 = local_18 + 0x50;
    local_188 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)0xa46ec7);
    local_1a8 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *)0xa46f06);
    while( true ) {
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffff680,
                         (iterator_base<const_slang::syntax::StreamExpressionSyntax_*> *)
                         in_stack_fffffffffffff678);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      local_1b0 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_false>
                               *)0xa46f75);
      not_null<slang::syntax::ExpressionSyntax_*>::operator*
                ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa46fb0);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_1c0,StreamingAllowed);
      extraFlags.m_bits._4_4_ = in_stack_fffffffffffff6a4;
      extraFlags.m_bits._0_4_ = in_stack_fffffffffffff6a0;
      local_1b8 = (SourceLocation)
                  Expression::selfDetermined
                            ((Compilation *)in_stack_fffffffffffff698,
                             (ExpressionSyntax *)
                             CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                             (ASTContext *)in_stack_fffffffffffff688,extraFlags);
      bVar2 = Expression::bad((Expression *)in_stack_fffffffffffff680);
      if (bVar2) {
        local_8 = (StreamingConcatenationExpression *)
                  fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
        goto LAB_00a47d2c;
      }
      local_1d0 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa4709f);
      local_1d8 = (Expression *)0x0;
      std::optional<unsigned_int>::optional((optional<unsigned_int> *)0xa470d2);
      if (local_1b0->withRange != (StreamExpressionWithRangeSyntax *)0x0) {
        bVar2 = Type::isUnpackedArray((Type *)in_stack_fffffffffffff678);
        if (bVar2) {
          bVar2 = Type::isAssociativeArray((Type *)0xa47115);
          if (!bVar2) {
            in_stack_fffffffffffff840 = Type::getArrayElementType((Type *)in_stack_fffffffffffff688)
            ;
            bVar2 = Type::isFixedSize(in_stack_fffffffffffff6c8);
            if (bVar2) {
              in_stack_fffffffffffff818 = local_10;
              in_stack_fffffffffffff820 = local_1b8;
              in_stack_fffffffffffff828 =
                   (SourceLocation)
                   not_null<slang::syntax::ElementSelectSyntax_*>::operator*
                             ((not_null<slang::syntax::ElementSelectSyntax_*> *)0xa47216);
              in_stack_fffffffffffff810 = local_20;
              bitmask<slang::ast::ASTFlags>::bitmask(local_238,StreamingWithRange);
              addedFlags.m_bits._4_4_ = in_stack_fffffffffffff694;
              addedFlags.m_bits._0_4_ = in_stack_fffffffffffff690;
              ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffff688,addedFlags);
              in_stack_fffffffffffff808 =
                   Expression::bindSelector
                             (in_stack_fffffffffffff758,
                              (Expression *)
                              CONCAT17(in_stack_fffffffffffff757.m_bits,in_stack_fffffffffffff750),
                              (ElementSelectSyntax *)in_stack_fffffffffffff748,
                              (ASTContext *)in_stack_fffffffffffff740);
              local_1d8 = in_stack_fffffffffffff808;
              in_stack_fffffffffffff807 = Expression::bad((Expression *)in_stack_fffffffffffff680);
              if (!(bool)in_stack_fffffffffffff807) {
                local_589[0].m_bits = '\0';
                bitmask<slang::ast::EvalFlags>::bitmask(local_589);
                EvalContext::EvalContext
                          (in_stack_fffffffffffff6b8,
                           (ASTContext *)
                           CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                           (bitmask<slang::ast::EvalFlags>)
                           (underlying_type)((ulong)in_stack_fffffffffffff6c0 >> 0x38));
                oVar12 = Expression::evalSelector
                                   ((Expression *)in_stack_fffffffffffff7a0.current,
                                    (EvalContext *)
                                    CONCAT17(in_stack_fffffffffffff79f.m_bits,
                                             in_stack_fffffffffffff798),
                                    SUB81((ulong)in_stack_fffffffffffff790.current >> 0x38,0));
                local_5a8 = oVar12.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload
                            .super__Optional_payload_base<slang::ConstantRange>._M_payload;
                local_5a0 = CONCAT31(local_5a0._1_3_,
                                     oVar12.super__Optional_base<slang::ConstantRange,_true,_true>.
                                     _M_payload.super__Optional_payload_base<slang::ConstantRange>.
                                     _M_engaged);
                local_590 = local_5a0;
                local_598 = local_5a8;
                bVar2 = std::optional::operator_cast_to_bool
                                  ((optional<slang::ConstantRange> *)0xa473b4);
                if (bVar2) {
                  std::optional<slang::ConstantRange>::operator->
                            ((optional<slang::ConstantRange> *)0xa473c7);
                  local_5b4 = ConstantRange::width((ConstantRange *)0xa473cf);
                  std::optional<unsigned_int>::optional<unsigned_int,_true>
                            ((optional<unsigned_int> *)in_stack_fffffffffffff680,
                             (uint *)in_stack_fffffffffffff678);
                  local_1e0 = local_5b0;
                }
                EvalContext::~EvalContext(in_stack_fffffffffffff680);
                goto LAB_00a47440;
              }
              local_8 = (StreamingConcatenationExpression *)
                        fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
              goto LAB_00a47d2c;
            }
          }
        }
        local_1e4 = 0x310007;
        local_1f8 = *(undefined8 *)((long)local_1b8 + 0x20);
        uStack_1f0 = *(undefined8 *)((long)local_1b8 + 0x28);
        sourceRange_01.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
        sourceRange_01.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
        sourceRange_01.startLoc._0_4_ = in_stack_fffffffffffff6a0;
        sourceRange_01.endLoc._0_4_ = in_stack_fffffffffffff6a8;
        sourceRange_01.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                            sourceRange_01);
        local_8 = (StreamingConcatenationExpression *)
                  fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
        goto LAB_00a47d2c;
      }
LAB_00a47440:
      pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                         ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa47451);
      if ((pEVar7->super_SyntaxNode).kind != StreamingConcatenationExpression) {
        bVar2 = Type::isUnpackedUnion((Type *)0xa4747c);
        if (bVar2) {
          bVar2 = Type::isTaggedUnion((Type *)in_stack_fffffffffffff688);
          if (!bVar2) {
            Type::getCanonicalType((Type *)in_stack_fffffffffffff680);
            local_5c0 = Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0xa474e0);
            sVar9 = Scope::members((Scope *)CONCAT44(in_stack_fffffffffffff694,
                                                     in_stack_fffffffffffff690));
            local_5d0 = sVar9;
            local_5d8 = (Symbol *)
                        std::ranges::
                        subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                        ::begin(&local_5d0);
            in_stack_fffffffffffff7a0 =
                 std::ranges::
                 subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                 ::end(&local_5d0);
            local_5e0 = in_stack_fffffffffffff7a0.current;
            in_stack_fffffffffffff79f.m_bits =
                 operator==<slang::ast::Scope::iterator>
                           ((self_type *)in_stack_fffffffffffff680,
                            (iterator *)in_stack_fffffffffffff678);
            if (((in_stack_fffffffffffff79f.m_bits ^ 0xff) & 1) != 0) {
              in_stack_fffffffffffff790 =
                   std::ranges::
                   subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
                   ::begin(&local_5d0);
              local_5e8 = in_stack_fffffffffffff790.current;
              iterator_facade<slang::ast::Scope::iterator,_false>::operator->
                        ((iterator_facade<slang::ast::Scope::iterator,_false> *)0xa475ec);
              Symbol::as<slang::ast::ValueSymbol>((Symbol *)0xa47603);
              local_1d0 = ValueSymbol::getType((ValueSymbol *)0xa4761a);
            }
          }
        }
        bVar2 = Type::isBitstreamType
                          ((Type *)in_stack_fffffffffffff6e8,(bool)in_stack_fffffffffffff6e7);
        if (!bVar2) {
          local_5ec = 0x2b0007;
          local_608 = *(undefined8 *)((long)local_1b8 + 0x20);
          uStack_600 = *(undefined8 *)((long)local_1b8 + 0x28);
          sourceRange_02.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
          sourceRange_02.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
          sourceRange_02.startLoc._0_4_ = in_stack_fffffffffffff6a0;
          sourceRange_02.endLoc._0_4_ = in_stack_fffffffffffff6a8;
          sourceRange_02.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                              sourceRange_02);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0xa476c6);
          ast::operator<<(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
          local_8 = (StreamingConcatenationExpression *)
                    fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
          goto LAB_00a47d2c;
        }
        local_618 = *(undefined8 *)((long)local_1b8 + 0x20);
        uStack_610 = *(undefined8 *)((long)local_1b8 + 0x28);
        sourceRange_05.startLoc._7_1_ = in_stack_fffffffffffff6e7;
        sourceRange_05.startLoc._0_7_ = in_stack_fffffffffffff6e0;
        sourceRange_05.endLoc = in_stack_fffffffffffff6e8;
        in_stack_fffffffffffff757.m_bits =
             Bitstream::checkClassAccess
                       (in_stack_fffffffffffff6d8,(ASTContext *)in_stack_fffffffffffff6d0,
                        sourceRange_05);
        if (!(bool)in_stack_fffffffffffff757.m_bits) {
          local_8 = (StreamingConcatenationExpression *)
                    fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
          goto LAB_00a47d2c;
        }
      }
      local_620 = 0;
      if (*(int *)local_1b8 == 0x11) {
        in_stack_fffffffffffff740 =
             Expression::as<slang::ast::StreamingConcatenationExpression>((Expression *)local_1b8);
        local_620 = getBitstreamWidth(in_stack_fffffffffffff740);
      }
      else if (local_1d8 == (Expression *)0x0) {
        local_620 = Type::getBitstreamWidth((Type *)in_stack_fffffffffffff688);
      }
      else {
        bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xa4781e);
        if (bVar2) {
          Type::getArrayElementType((Type *)in_stack_fffffffffffff688);
          Type::getBitstreamWidth((Type *)in_stack_fffffffffffff688);
          std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0xa47862);
          oVar10 = checkedMulU64(CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                                 (uint64_t)in_stack_fffffffffffff688);
          local_630._M_value =
               oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          local_628 = oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged;
          bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0xa478af);
          if (bVar2) {
            local_631 = (type_conflict)
                        std::operator<=><unsigned_long,_unsigned_long>
                                  ((optional<unsigned_long> *)in_stack_fffffffffffff698,
                                   (unsigned_long *)
                                   CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690));
            std::__cmp_cat::__unspec::__unspec(&local_632,(__unspec *)0x0);
            bVar2 = std::operator>(local_631);
            if (!bVar2) {
              puVar8 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0xa4798d);
              local_620 = *puVar8;
              goto LAB_00a479c3;
            }
          }
          local_638 = 0x180009;
          local_648 = (local_1d8->sourceRange).startLoc;
          SStack_640 = (local_1d8->sourceRange).endLoc;
          sourceRange_03.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
          sourceRange_03.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
          sourceRange_03.startLoc._0_4_ = in_stack_fffffffffffff6a0;
          sourceRange_03.endLoc._0_4_ = in_stack_fffffffffffff6a8;
          sourceRange_03.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
          ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                              sourceRange_03);
          local_8 = (StreamingConcatenationExpression *)
                    fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
          goto LAB_00a47d2c;
        }
      }
LAB_00a479c3:
      local_f8 = local_620 + local_f8;
      if (0x3fffffff8 < local_f8) {
        local_64c = 0x180009;
        local_660 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff6d0);
        sourceRange_04.startLoc._4_2_ = in_stack_fffffffffffff6a4.subsystem;
        sourceRange_04.startLoc._6_2_ = in_stack_fffffffffffff6a4.code;
        sourceRange_04.startLoc._0_4_ = in_stack_fffffffffffff6a0;
        sourceRange_04.endLoc._0_4_ = in_stack_fffffffffffff6a8;
        sourceRange_04.endLoc._4_4_ = in_stack_fffffffffffff6ac._M_value;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff698,in_stack_fffffffffffff6b4,
                            sourceRange_04);
        local_8 = (StreamingConcatenationExpression *)
                  fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
        goto LAB_00a47d2c;
      }
      local_680 = local_1b8;
      not_null<const_slang::ast::Expression_*>::not_null<slang::ast::Expression_*>
                (&local_678,(Expression **)&local_680);
      local_670 = local_1d8;
      local_668 = local_1e0;
      SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::push_back
                ((SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *)
                 in_stack_fffffffffffff680,(StreamExpression *)in_stack_fffffffffffff678);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::iterator_base<const_slang::syntax::StreamExpressionSyntax_*>,_false>
                  *)in_stack_fffffffffffff680);
    }
    Compilation::getVoidType(local_10);
    width_00 = (bitwidth_t)((ulong)in_stack_fffffffffffff740 >> 0x20);
    sVar11 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::ccopy
                       ((SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                         *)CONCAT44(in_stack_fffffffffffff6a4,in_stack_fffffffffffff6a0),
                        (BumpAllocator *)in_stack_fffffffffffff698);
    local_698 = sVar11;
    local_6a8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)sVar11._M_ptr);
    local_688 = BumpAllocator::
                emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_long&,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                          ((BumpAllocator *)sVar11._M_ptr,
                           (Type *)sVar11._M_extent._M_extent_value._M_extent_value,
                           (unsigned_long *)local_6a8.startLoc,(unsigned_long *)local_6a8.endLoc,
                           (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                            *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                           (SourceRange *)
                           CONCAT44(in_stack_fffffffffffff6ac._M_value,in_stack_fffffffffffff6a8));
    bitmask<slang::ast::ASTFlags>::bitmask(&local_6b0,StreamingAllowed);
    bVar2 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)
                       CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                       (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffff688);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8 = local_688;
    }
    else {
      local_6c0 = 0xffffff;
      puVar8 = std::min<unsigned_long>(&local_f8,&local_6c0);
      local_6b8 = *puVar8;
      bitmask<slang::ast::IntegralFlags>::bitmask(&local_6c9,FourState);
      local_6c8 = Compilation::getType(in_stack_fffffffffffff748,width_00,in_stack_fffffffffffff757)
      ;
      assignmentRange.endLoc = in_stack_fffffffffffff828;
      assignmentRange.startLoc = in_stack_fffffffffffff820;
      local_8 = (StreamingConcatenationExpression *)
                Expression::convertAssignment
                          ((ASTContext *)in_stack_fffffffffffff818,in_stack_fffffffffffff810,
                           in_stack_fffffffffffff808,assignmentRange,
                           (Expression **)
                           CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                           (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffff840);
    }
LAB_00a47d2c:
    local_1c4 = 1;
    SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL>::~SmallVector
              ((SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> *)
               0xa47d39);
  }
  else {
    local_68 = 0x2a0007;
    local_70 = parsing::Token::location((Token *)(local_18 + 0x28));
    ASTContext::addDiag((ASTContext *)CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                        in_stack_fffffffffffff6a4,in_stack_fffffffffffff698);
    local_8 = (StreamingConcatenationExpression *)
              fromSyntax::anon_class_24_3_37492b14::operator()(in_stack_fffffffffffff6c0);
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context) {

    const bool isDestination = context.flags.has(ASTFlags::LValue);
    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    uint64_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, 0u,
                                 std::span<const StreamExpression>(), syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed) &&
        (isDestination || !comp.hasFlag(CompilationFlags::AllowSelfDeterminedStreamConcat))) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->getBitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<uint32_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    uint64_t bitstreamWidth = 0;
    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        auto& arg = selfDetermined(comp, *argSyntax->expression, context,
                                   ASTFlags::StreamingAllowed);
        if (arg.bad())
            return badResult();

        const Type* argType = arg.type;
        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue).
            if (!argType->isUnpackedArray() || argType->isAssociativeArray() ||
                !argType->getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg.sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            // If they are constant, we've already done bounds checking and
            // max size checking on them.
            EvalContext evalCtx(context);
            auto range = withExpr->evalSelector(evalCtx, /* enforceBounds */ false);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            if (argType->isUnpackedUnion() && !argType->isTaggedUnion()) {
                auto& uu = argType->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    argType = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!argType->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg.sourceRange) << *arg.type;
                return badResult();
            }

            if (!Bitstream::checkClassAccess(*argType, context, arg.sourceRange))
                return badResult();
        }

        uint64_t argWidth = 0;
        if (arg.kind == ExpressionKind::Streaming) {
            argWidth = arg.as<StreamingConcatenationExpression>().getBitstreamWidth();
        }
        else if (withExpr) {
            if (constantWithWidth) {
                auto rangeBits = checkedMulU64(argType->getArrayElementType()->getBitstreamWidth(),
                                               *constantWithWidth);
                if (!rangeBits || rangeBits > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, withExpr->sourceRange);
                    return badResult();
                }

                argWidth = *rangeBits;
            }
        }
        else {
            argWidth = argType->getBitstreamWidth();
        }

        bitstreamWidth += argWidth;
        if (bitstreamWidth > Type::MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
            return badResult();
        }

        buffer.push_back({&arg, withExpr, constantWithWidth});
    }

    // So normally the type of a streaming concatenation is never inspected,
    // since it can only be used in assignments and there is explicit handling
    // of these expressions there. We use a void type for the result to represent
    // this (also because otherwise what type can we use for e.g. non fixed-size
    // streams). However, in VCS compat mode the error about requiring an assignment
    // context can be silenced, so we need to come up with a real result type here,
    // which we do by converting to a packed bit vector of bitstream width.
    auto& result = *comp.emplace<StreamingConcatenationExpression>(
        comp.getVoidType(), sliceSize, bitstreamWidth, buffer.ccopy(comp), syntax.sourceRange());

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        // Cap the width so we don't overflow. The conversion will error for us
        // since the target width will be less than the source width.
        auto width = std::min(bitstreamWidth, (uint64_t)SVInt::MAX_BITS);
        auto& type = comp.getType(bitwidth_t(width), IntegralFlags::FourState);
        return convertAssignment(context, type, result, result.sourceRange);
    }

    return result;
}